

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::output_example(vw *all,cb_explore_adf *c,multi_ex *ec_seq)

{
  int iVar1;
  action_score *paVar2;
  int *piVar3;
  wclass *pwVar4;
  _func_void_int_string_v_array<char> *p_Var5;
  v_array<char> vVar6;
  bool bVar7;
  pointer ppeVar8;
  ostream *poVar9;
  ulong uVar10;
  example *ec;
  size_t num_features;
  long lVar11;
  int *piVar12;
  float *pfVar13;
  ulong uVar14;
  long lVar15;
  float loss;
  float fVar16;
  string outputString;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdef;
  example *peVar17;
  vw *all_00;
  undefined4 in_stack_fffffffffffffe00;
  float fVar18;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  ppeVar8 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar8) {
    ec = *ppeVar8;
    ppeVar8 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar2 = (ec->pred).a_s._begin;
    pfVar13 = (ec->pred).scalars._end;
    if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppeVar8) {
      uVar10 = 0;
      num_features = 0;
    }
    else {
      num_features = 0;
      uVar14 = 0;
      do {
        bVar7 = CB::ec_is_example_header(ppeVar8[uVar14]);
        if (!bVar7) {
          num_features = num_features +
                         (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                         .super__Vector_impl_data._M_start[uVar14]->num_features;
        }
        uVar14 = uVar14 + 1;
        ppeVar8 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppeVar8 >> 3;
      } while (uVar14 < uVar10);
    }
    fVar18 = (c->gen_cs).known_cost.probability;
    loss = 0.0;
    bVar7 = 0.0 < fVar18;
    if ((0.0 < fVar18) && (lVar11 = (long)pfVar13 - (long)paVar2, lVar11 != 0)) {
      uVar14 = 0;
      do {
        fVar16 = (c->gen_cs).known_cost.cost / (c->gen_cs).known_cost.probability;
        if ((c->gen_cs).known_cost.action != paVar2[uVar14].action) {
          fVar16 = 0.0;
        }
        loss = loss + fVar16 * paVar2[uVar14].score;
        uVar14 = uVar14 + 1;
      } while ((uVar14 & 0xffffffff) < (ulong)(lVar11 >> 3));
    }
    if (uVar10 != 0) {
      uVar14 = 0;
      do {
        bVar7 = (bool)(bVar7 & ppeVar8[uVar14]->test_only);
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
    peVar17 = ec;
    all_00 = all;
    shared_data::update(all->sd,bVar7,0.0 < fVar18,loss,ec->weight,num_features);
    piVar12 = (all->final_prediction_sink)._begin;
    piVar3 = (all->final_prediction_sink)._end;
    if (piVar12 != piVar3) {
      do {
        ACTION_SCORE::print_action_score
                  (*piVar12,(v_array<ACTION_SCORE::action_score> *)&(ec->pred).scalars,&ec->tag);
        piVar12 = piVar12 + 1;
      } while (piVar12 != piVar3);
    }
    if (0 < all_00->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      pwVar4 = (ec->l).cs.costs._begin;
      lVar11 = (long)(ec->l).cs.costs._end - (long)pwVar4;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 4;
        pfVar13 = &pwVar4->wap_value;
        lVar15 = 0;
        do {
          if (lVar15 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdef,1);
          }
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdef = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,&stack0xfffffffffffffdef,1);
          std::ostream::_M_insert<double>((double)*pfVar13);
          lVar15 = lVar15 + 1;
          pfVar13 = pfVar13 + 4;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar15);
      }
      p_Var5 = all_00->print_text;
      iVar1 = all_00->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar6._begin._7_1_ = in_stack_fffffffffffffdef;
      vVar6._begin._0_7_ = in_stack_fffffffffffffde8;
      vVar6._end = (char *)peVar17;
      vVar6.end_array = (char *)all_00;
      vVar6.erase_count._0_4_ = in_stack_fffffffffffffe00;
      vVar6.erase_count._4_4_ = fVar18;
      (*p_Var5)(iVar1,(string)peVar17->tag,vVar6);
      ec = peVar17;
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
        ec = peVar17;
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    CB::print_update(all_00,fVar18 <= 0.0,ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_explore_adf& c, multi_ex& ec_seq)
{
  if (ec_seq.size() <= 0)
    return;

  size_t num_features = 0;

  float loss = 0.;

  auto& ec = *ec_seq[0];
  ACTION_SCORE::action_scores preds = ec.pred.a_s;

  for (size_t i = 0; i < ec_seq.size(); i++)
    if (!CB::ec_is_example_header(*ec_seq[i]))
      num_features += ec_seq[i]->num_features;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.gen_cs.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq.size(); i++) holdout_example &= ec_seq[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, &ec_seq, true);
}